

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O3

void __thiscall
psy::C::Parser::DiagnosticsReporter::UnexpectedInitializerOfDeclarator(DiagnosticsReporter *this)

{
  long *local_e8 [2];
  long local_d8 [2];
  long *local_c8 [2];
  long local_b8 [2];
  long *local_a8 [2];
  long local_98 [2];
  DiagnosticDescriptor local_88;
  
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,ID_of_UnexpectedInitializerOfDeclarator_abi_cxx11_._M_dataplus._M_p,
             ID_of_UnexpectedInitializerOfDeclarator_abi_cxx11_._M_dataplus._M_p +
             ID_of_UnexpectedInitializerOfDeclarator_abi_cxx11_._M_string_length);
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c8,"[[unexpected initializer for declarator]]","");
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e8,"declarator may not be initialized","");
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_88,local_a8,local_c8,local_e8,2,1);
  diagnoseOrDelayDiagnostic(this,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.description_._M_dataplus._M_p != &local_88.description_.field_2) {
    operator_delete(local_88.description_._M_dataplus._M_p,
                    local_88.description_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.title_._M_dataplus._M_p != &local_88.title_.field_2) {
    operator_delete(local_88.title_._M_dataplus._M_p,
                    local_88.title_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.id_._M_dataplus._M_p != &local_88.id_.field_2) {
    operator_delete(local_88.id_._M_dataplus._M_p,local_88.id_.field_2._M_allocated_capacity + 1);
  }
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  return;
}

Assistant:

void Parser::DiagnosticsReporter::UnexpectedInitializerOfDeclarator()
{
    diagnoseOrDelayDiagnostic(
                DiagnosticDescriptor(ID_of_UnexpectedInitializerOfDeclarator,
                                     "[[unexpected initializer for declarator]]",
                                     "declarator may not be initialized",
                                     DiagnosticSeverity::Error,
                                     DiagnosticCategory::Syntax));
}